

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O3

SUNErrCode
SUNDataNode_CreateList
          (SUNDataIOMode io_mode,sundataindex num_elements,SUNContext_conflict sunctx,
          SUNDataNode *node_out)

{
  SUNErrCode SVar1;
  SUNContext_conflict sunctx_local_scope_;
  
  if (io_mode != SUNDATAIOMODE_INMEM) {
    return -0x270d;
  }
  SVar1 = SUNDataNode_CreateList_InMem(num_elements,sunctx,node_out);
  return SVar1;
}

Assistant:

SUNErrCode SUNDataNode_CreateList(SUNDataIOMode io_mode,
                                  sundataindex num_elements, SUNContext sunctx,
                                  SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  SUNErrCode err = SUN_SUCCESS;
  switch (io_mode)
  {
  case (SUNDATAIOMODE_INMEM):
    err = SUNDataNode_CreateList_InMem(num_elements, sunctx, node_out);
    break;
  default: err = SUN_ERR_ARG_OUTOFRANGE;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);

  SUNCheck(err == SUN_SUCCESS, err);

  return err;
}